

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O2

void CheckAndSortAliases(s_assenv *ae)

{
  s_alias *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  s_alias *psVar13;
  s_alias tmpalias;
  
  iVar11 = ae->ialias;
  uVar12 = (long)iVar11 - 1;
  uVar5 = 0;
  if (0 < (int)uVar12) {
    uVar5 = uVar12 & 0xffffffff;
  }
  lVar8 = 0;
  do {
    if (uVar5 * 0x18 + 0x18 == lVar8 + 0x18) goto LAB_001161f1;
    psVar13 = ae->alias;
    pcVar6 = strstr(psVar13[uVar12].translation,*(char **)((long)&psVar13->alias + lVar8));
    lVar8 = lVar8 + 0x18;
  } while (pcVar6 == (char *)0x0);
  ExpressionFastTranslate(ae,&psVar13[uVar12].translation,2);
  psVar13 = ae->alias;
  iVar11 = ae->ialias;
  sVar7 = strlen(psVar13[(long)iVar11 + -1].translation);
  psVar13[(long)iVar11 + -1].len = (int)sVar7;
  uVar12 = (ulong)(iVar11 - 1);
LAB_001161f1:
  if ((int)uVar12 != 0) {
    psVar13 = ae->alias;
    lVar8 = (long)(int)uVar12;
    sVar7 = lVar8 * 0x18;
    iVar2 = psVar13[lVar8].crc;
    if (iVar2 <= psVar13[(long)iVar11 + -2].crc) {
      if (iVar2 < psVar13->crc) {
        psVar1 = psVar13 + lVar8;
        tmpalias.crc = psVar1->crc;
        tmpalias.len = psVar1->len;
        tmpalias.alias = psVar1->alias;
        tmpalias.translation = psVar1->translation;
        memmove(psVar13 + 1,psVar13,sVar7);
        psVar13 = ae->alias;
      }
      else {
        iVar10 = 0;
        while( true ) {
          uVar9 = (uint)sVar7;
          if ((int)uVar12 < iVar10) break;
          uVar9 = (uint)((int)uVar12 + iVar10) >> 1;
          sVar7 = (size_t)uVar9;
          iVar3 = psVar13[sVar7].crc;
          if (iVar3 == iVar2) break;
          iVar4 = uVar9 + 1;
          if (iVar2 <= iVar3) {
            iVar4 = iVar10;
          }
          if (iVar2 < iVar3) {
            iVar4 = iVar10;
          }
          iVar10 = iVar4;
          uVar12 = uVar12 & 0xffffffff;
          if (iVar2 < iVar3) {
            uVar12 = (ulong)(uVar9 - 1);
          }
        }
        uVar9 = uVar9 + (psVar13[(int)uVar9].crc < iVar2);
        tmpalias.crc = psVar13[(long)iVar11 + -1].crc;
        tmpalias.len = psVar13[(long)iVar11 + -1].len;
        tmpalias.alias = psVar13[(long)iVar11 + -1].alias;
        tmpalias.translation = psVar13[(long)iVar11 + -1].translation;
        memmove(psVar13 + (long)(int)uVar9 + 1,psVar13 + (int)uVar9,
                (long)(int)(iVar11 + ~uVar9) * 0x18);
        psVar13 = ae->alias + (int)uVar9;
      }
      psVar13->crc = tmpalias.crc;
      psVar13->len = tmpalias.len;
      psVar13->alias = tmpalias.alias;
      psVar13->translation = tmpalias.translation;
    }
  }
  return;
}

Assistant:

void CheckAndSortAliases(struct s_assenv *ae)
{
	#undef FUNC
	#define FUNC "CheckAndSortAliases"

	struct s_alias tmpalias;
	int i,dw,dm,du,crc;
	for (i=0;i<ae->ialias-1;i++) {
		/* is there previous aliases in the new alias? */
		if (strstr(ae->alias[ae->ialias-1].translation,ae->alias[i].alias)) {
			/* there is a match, apply alias translation */
			ExpressionFastTranslate(ae,&ae->alias[ae->ialias-1].translation,2);
			/* need to compute again len */
			ae->alias[ae->ialias-1].len=strlen(ae->alias[ae->ialias-1].translation);
			break;
		}
	}
	
	/* cas particuliers pour insertion en d�but ou fin de liste */
	if (ae->ialias-1) {
		if (ae->alias[ae->ialias-1].crc>ae->alias[ae->ialias-2].crc) {
			/* pas de tri il est d�j� au bon endroit */
		} else if (ae->alias[ae->ialias-1].crc<ae->alias[0].crc) {
			/* insertion tout en bas de liste */
			tmpalias=ae->alias[ae->ialias-1];
			MemMove(&ae->alias[1],&ae->alias[0],sizeof(struct s_alias)*(ae->ialias-1));
			ae->alias[0]=tmpalias;
		} else {
			/* on cherche ou inserer */
			crc=ae->alias[ae->ialias-1].crc;
			dw=0;
			du=ae->ialias-1;
			while (dw<=du) {
				dm=(dw+du)/2;
				if (ae->alias[dm].crc==crc) {
					break;
				} else if (ae->alias[dm].crc>crc) {
					du=dm-1;
				} else if (ae->alias[dm].crc<crc) {
					dw=dm+1;
				}
			}
			/* ajustement */
			if (ae->alias[dm].crc<crc) dm++;
			/* insertion */
			tmpalias=ae->alias[ae->ialias-1];
			MemMove(&ae->alias[dm+1],&ae->alias[dm],sizeof(struct s_alias)*(ae->ialias-1-dm));
			ae->alias[dm]=tmpalias;
		}
	} else {
		/* one alias need no sort */
	}
}